

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O3

void __thiscall
ElementsConfidentialAddress_P2shAddressFromString_Test::TestBody
          (ElementsConfidentialAddress_P2shAddressFromString_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_4;
  ElementsConfidentialAddress address;
  AssertHelper local_3c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  AssertHelper local_3b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  undefined1 local_3a0 [24];
  string local_388;
  undefined1 local_368 [16];
  void *local_358;
  void *local_340;
  void *local_328;
  code *local_310 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_298;
  Script local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240 [2];
  ElementsConfidentialAddress local_1d8 [432];
  
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1d8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3b0.data_ = (AssertHelperData *)local_3a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b0,
                 "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnoKqrKf3qi2c9KJdah9d62ovTckv5uzzZC",
                 "");
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&local_388,(string *)&local_3b0);
      cfd::core::ElementsConfidentialAddress::operator=
                (local_1d8,(ElementsConfidentialAddress *)&local_388);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&local_388);
      if (local_3b0.data_ != (AssertHelperData *)local_3a0) {
        operator_delete(local_3b0.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x135,
               "Expected: (address = ElementsConfidentialAddress( \"VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnoKqrKf3qi2c9KJdah9d62ovTckv5uzzZC\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b0,
             "\"VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnoKqrKf3qi2c9KJdah9d62ovTckv5uzzZC\"",
             "address.GetAddress().c_str()",
             "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnoKqrKf3qi2c9KJdah9d62ovTckv5uzzZC",
             (char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  paVar1 = &local_388.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  }
  if (local_3b0.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x138,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
             (char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  }
  if (local_3b0.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3b0.data_);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x13b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetHash();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"be8f7ae2233fc122be82f2cf9fe3cc2c6196218a\"",
             "address.GetHash().GetHex().c_str()","be8f7ae2233fc122be82f2cf9fe3cc2c6196218a",
             (char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  }
  if (local_3b0.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3b0.data_);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x13d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"GzZ7frEGCDVVivMdSQA57zY1cRjYVu1g2r\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "GzZ7frEGCDVVivMdSQA57zY1cRjYVu1g2r",(char *)local_3b0.data_);
  if (local_3b0.data_ != (AssertHelperData *)local_3a0) {
    operator_delete(local_3b0.data_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_240);
  cfd::core::Script::~Script(&local_280);
  local_310[0] = cfd::core::SchnorrSignature::SchnorrSignature;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_298);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_310);
  if (local_328 != (void *)0x0) {
    operator_delete(local_328);
  }
  if (local_340 != (void *)0x0) {
    operator_delete(local_340);
  }
  if (local_358 != (void *)0x0) {
    operator_delete(local_358);
  }
  if ((undefined1 *)local_388.field_2._M_allocated_capacity != local_368) {
    operator_delete((void *)local_388.field_2._M_allocated_capacity);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x13f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  cVar3 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)&local_388);
  local_3b0.data_._0_1_ = (string)cVar3;
  local_3a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) == paVar1) {
    if (cVar3 == '\0') goto LAB_00310905;
  }
  else {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
    if (((ulong)local_3b0.data_ & 1) == 0) {
LAB_00310905:
      testing::Message::Message((Message *)&local_3c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_388,(internal *)&local_3b0,
                 (AssertionResult *)
                 "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_3a0 + 0x10),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
                 ,0x141,(char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                         (char)local_388._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_3a0 + 0x10),(Message *)&local_3c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_3a0 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1)
      {
        operator_delete((undefined1 *)
                        CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p))
        ;
      }
      if (((CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != 0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.data_._0_4_ = 3;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetNetType();
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_388,"ElementsNetType::kLiquidV1","address.GetNetType()",
             (NetType *)&local_3b0,(NetType *)&local_3c0);
  if ((char)local_388._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_388._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_388._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x142,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((local_3b0.data_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_3b0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_388._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.data_._0_4_ = 1;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetAddressType();
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&local_388,"ElementsAddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_3b0,(AddressType *)&local_3c0);
  if ((char)local_388._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_388._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_388._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x143,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((local_3b0.data_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_3b0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_388._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3b0.data_ = (AssertHelperData *)local_3a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b0,
                 "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBprXEMfscpFfYRqjkT2CjY7QAxtAv5PHkX",
                 "");
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&local_388,(string *)&local_3b0);
      cfd::core::ElementsConfidentialAddress::operator=
                (local_1d8,(ElementsConfidentialAddress *)&local_388);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&local_388);
      if (local_3b0.data_ != (AssertHelperData *)local_3a0) {
        operator_delete(local_3b0.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_388);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x148,
               "Expected: (address = ElementsConfidentialAddress( \"AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBprXEMfscpFfYRqjkT2CjY7QAxtAv5PHkX\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3b0,
             "\"AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBprXEMfscpFfYRqjkT2CjY7QAxtAv5PHkX\"",
             "address.GetAddress().c_str()",
             "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBprXEMfscpFfYRqjkT2CjY7QAxtAv5PHkX",
             (char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  }
  if (local_3b0.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3a8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3a8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x14b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
             (char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  }
  if (local_3b0.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3b0.data_);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x14e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetHash();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"be8f7ae2233fc122be82f2cf9fe3cc2c6196218a\"",
             "address.GetHash().GetHex().c_str()","be8f7ae2233fc122be82f2cf9fe3cc2c6196218a",
             (char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  }
  if (local_3b0.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3b0.data_);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x150,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3c0,"\"XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA",(char *)local_3b0.data_);
  if (local_3b0.data_ != (AssertHelperData *)local_3a0) {
    operator_delete(local_3b0.data_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_240);
  cfd::core::Script::~Script(&local_280);
  local_310[0] = cfd::core::SchnorrSignature::SchnorrSignature;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_298);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_310);
  if (local_328 != (void *)0x0) {
    operator_delete(local_328);
  }
  if (local_340 != (void *)0x0) {
    operator_delete(local_340);
  }
  if (local_358 != (void *)0x0) {
    operator_delete(local_358);
  }
  if ((undefined1 *)local_388.field_2._M_allocated_capacity != local_368) {
    operator_delete((void *)local_388.field_2._M_allocated_capacity);
  }
  if (local_3c0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_388);
    if (local_3b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_3b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x152,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (((CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  cVar3 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)&local_388);
  local_3b0.data_._0_1_ = (string)cVar3;
  local_3a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) == paVar1) {
    if (cVar3 != '\0') goto LAB_0031116e;
  }
  else {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
    if (((ulong)local_3b0.data_ & 1) != 0) goto LAB_0031116e;
  }
  testing::Message::Message((Message *)&local_3c0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_388,(internal *)&local_3b0,
             (AssertionResult *)
             "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)(local_3a0 + 0x10),kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x154,(char *)CONCAT71(local_388._M_dataplus._M_p._1_7_,
                                     (char)local_388._M_dataplus._M_p));
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)(local_3a0 + 0x10),(Message *)&local_3c0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_3a0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_388._M_dataplus._M_p._1_7_,(char)local_388._M_dataplus._M_p));
  }
  if (((CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != 0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) + 8))();
  }
LAB_0031116e:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.data_._0_4_ = 4;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetNetType();
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_388,"ElementsNetType::kElementsRegtest","address.GetNetType()",
             (NetType *)&local_3b0,(NetType *)&local_3c0);
  if ((char)local_388._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_388._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_388._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x155,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((local_3b0.data_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_3b0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_388._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b0.data_._0_4_ = 1;
  local_3c0.data_._0_4_ = cfd::core::ElementsConfidentialAddress::GetAddressType();
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&local_388,"ElementsAddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_3b0,(AddressType *)&local_3c0);
  if ((char)local_388._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    if ((undefined8 *)local_388._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_388._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x156,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (((local_3b0.data_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_3b0.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_388._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_1d8);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2shAddressFromString) {
  ElementsConfidentialAddress address;

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnoKqrKf3qi2c9KJdah9d62ovTckv5uzzZC")));
  EXPECT_STREQ(
      "VJLBL3rkCh19CDi889GPXkn1BYqUih5DF2p8ViS2J4Tr2cnoKqrKf3qi2c9KJdah9d62ovTckv5uzzZC",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("be8f7ae2233fc122be82f2cf9fe3cc2c6196218a",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("GzZ7frEGCDVVivMdSQA57zY1cRjYVu1g2r",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBprXEMfscpFfYRqjkT2CjY7QAxtAv5PHkX")));
  EXPECT_STREQ(
      "AzppkWN3gNvcnBu2Pm4Nsi8EdCmugMU2zjbpsMQZGBfMDmBprXEMfscpFfYRqjkT2CjY7QAxtAv5PHkX",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("be8f7ae2233fc122be82f2cf9fe3cc2c6196218a",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2shAddress, address.GetAddressType());
}